

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mraa.c
# Opt level: O0

int mraa_set_priority(int priority)

{
  int iVar1;
  int iVar2;
  sched_param local_10;
  int local_c;
  sched_param sched_s;
  int priority_local;
  
  local_c = priority;
  memset(&local_10,0,4);
  iVar2 = local_c;
  iVar1 = sched_get_priority_max(2);
  if (iVar1 < iVar2) {
    local_10.__sched_priority = sched_get_priority_max(2);
  }
  else {
    local_10.__sched_priority = local_c;
  }
  iVar2 = sched_setscheduler(0,2,&local_10);
  return iVar2;
}

Assistant:

int
mraa_set_priority(const int priority)
{
    struct sched_param sched_s;

    memset(&sched_s, 0, sizeof(struct sched_param));
    if (priority > sched_get_priority_max(SCHED_RR)) {
        sched_s.sched_priority = sched_get_priority_max(SCHED_RR);
    } else {
        sched_s.sched_priority = priority;
    }

    return sched_setscheduler(0, SCHED_RR, &sched_s);
}